

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss_test.cc
# Opt level: O0

void __thiscall HRSS_Random_Test::TestBody(HRSS_Random_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_1ee0;
  Message local_1ed8;
  Span<const_unsigned_char> local_1ed0;
  Bytes local_1ec0;
  Span<const_unsigned_char> local_1eb0;
  Bytes local_1ea0;
  undefined1 local_1e90 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_1e60;
  Message local_1e58;
  int local_1e4c;
  undefined1 local_1e48 [8];
  AssertionResult gtest_ar__3;
  uint8_t bit;
  uint32_t offset;
  Message local_1e28;
  Span<const_unsigned_char> local_1e20;
  Bytes local_1e10;
  Span<const_unsigned_char> local_1e00;
  Bytes local_1df0;
  undefined1 local_1de0 [8];
  AssertionResult gtest_ar;
  AssertHelper local_1db0;
  Message local_1da8;
  int local_1d9c;
  undefined1 local_1d98 [8];
  AssertionResult gtest_ar__2;
  uint8_t shared_key2 [32];
  string local_1d60;
  AssertHelper local_1d40;
  Message local_1d38;
  int local_1d2c;
  undefined1 local_1d28 [8];
  AssertionResult gtest_ar__1;
  uint8_t shared_key [32];
  uint8_t ciphertext [1138];
  Bytes local_1870;
  ScopedTrace local_1859;
  uchar local_1858 [7];
  ScopedTrace gtest_trace_181;
  uint8_t encap_entropy [1400];
  uint j;
  AssertHelper local_12b8;
  Message local_12b0 [3];
  int local_1294;
  undefined1 local_1290 [8];
  AssertionResult gtest_ar_;
  HRSS_private_key priv;
  HRSS_public_key pub;
  Bytes local_5d0;
  ScopedTrace local_5b9;
  uchar local_5b8 [7];
  ScopedTrace gtest_trace_172;
  uint8_t generate_key_entropy [1432];
  uint local_14;
  uint i;
  HRSS_Random_Test *this_local;
  
  local_14 = 0;
  do {
    if (9 < local_14) {
      return;
    }
    RAND_bytes(local_5b8,0x598);
    bssl::Span<unsigned_char_const>::Span<1432ul>
              ((Span<unsigned_char_const> *)(pub.opaque + 0x588),(uchar (*) [1432])local_5b8);
    Bytes::Bytes(&local_5d0,stack0xfffffffffffffa20);
    testing::ScopedTrace::ScopedTrace<Bytes>
              (&local_5b9,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
               ,0xac,&local_5d0);
    local_1294 = HRSS_generate_key((HRSS_public_key *)(priv.opaque + 0x708),
                                   (HRSS_private_key *)&gtest_ar_.message_,(uint8_t *)local_5b8);
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_1290,&local_1294,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1290);
    if (!bVar1) {
      testing::Message::Message(local_12b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&j,(internal *)local_1290,
                 (AssertionResult *)"HRSS_generate_key(&pub, &priv, generate_key_entropy)","false",
                 "true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_12b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                 ,0xb0,pcVar2);
      testing::internal::AssertHelper::operator=(&local_12b8,local_12b0);
      testing::internal::AssertHelper::~AssertHelper(&local_12b8);
      std::__cxx11::string::~string((string *)&j);
      testing::Message::~Message(local_12b0);
    }
    bVar1 = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1290);
    if (!bVar1) {
      encap_entropy[0x570] = '\0';
      encap_entropy[0x571] = '\0';
      encap_entropy[0x572] = '\0';
      encap_entropy[0x573] = '\0';
      for (; (uint)encap_entropy._1392_4_ < 10; encap_entropy._1392_4_ = encap_entropy._1392_4_ + 1)
      {
        RAND_bytes(local_1858,0x578);
        bssl::Span<unsigned_char_const>::Span<1400ul>
                  ((Span<unsigned_char_const> *)(ciphertext + 0x470),(uchar (*) [1400])local_1858);
        Bytes::Bytes(&local_1870,stack0xffffffffffffe780);
        testing::ScopedTrace::ScopedTrace<Bytes>
                  (&local_1859,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                   ,0xb5,&local_1870);
        local_1d2c = HRSS_encap(shared_key + 0x18,(uint8_t *)&gtest_ar__1.message_,
                                (HRSS_public_key *)(priv.opaque + 0x708),local_1858);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_1d28,&local_1d2c,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d28);
        if (!bVar1) {
          testing::Message::Message(&local_1d38);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_1d60,(internal *)local_1d28,
                     (AssertionResult *)"HRSS_encap(ciphertext, shared_key, &pub, encap_entropy)",
                     "false","true",in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_1d40,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                     ,0xb9,pcVar2);
          testing::internal::AssertHelper::operator=(&local_1d40,&local_1d38);
          testing::internal::AssertHelper::~AssertHelper(&local_1d40);
          std::__cxx11::string::~string((string *)&local_1d60);
          testing::Message::~Message(&local_1d38);
        }
        bVar1 = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d28);
        if (!bVar1) {
          local_1d9c = HRSS_decap((uint8_t *)&gtest_ar__2.message_,
                                  (HRSS_private_key *)&gtest_ar_.message_,shared_key + 0x18,0x472);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_1d98,&local_1d9c,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d98);
          if (!bVar1) {
            testing::Message::Message(&local_1da8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar.message_,(internal *)local_1d98,
                       (AssertionResult *)
                       "HRSS_decap(shared_key2, &priv, ciphertext, sizeof(ciphertext))","false",
                       "true",in_R9);
            pcVar2 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_1db0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                       ,0xbd,pcVar2);
            testing::internal::AssertHelper::operator=(&local_1db0,&local_1da8);
            testing::internal::AssertHelper::~AssertHelper(&local_1db0);
            std::__cxx11::string::~string((string *)&gtest_ar.message_);
            testing::Message::~Message(&local_1da8);
          }
          bVar1 = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d98);
          if (!bVar1) {
            bssl::Span<unsigned_char_const>::Span<32ul>
                      ((Span<unsigned_char_const> *)&local_1e00,
                       (uchar (*) [32])&gtest_ar__1.message_);
            Bytes::Bytes(&local_1df0,local_1e00);
            bssl::Span<unsigned_char_const>::Span<32ul>
                      ((Span<unsigned_char_const> *)&local_1e20,
                       (uchar (*) [32])&gtest_ar__2.message_);
            Bytes::Bytes(&local_1e10,local_1e20);
            testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                      ((EqHelper *)local_1de0,"Bytes(shared_key)","Bytes(shared_key2)",&local_1df0,
                       &local_1e10);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1de0);
            if (!bVar1) {
              testing::Message::Message(&local_1e28);
              pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1de0);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffe1d0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                         ,0xbe,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&stack0xffffffffffffe1d0,&local_1e28);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffe1d0);
              testing::Message::~Message(&local_1e28);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1de0);
            RAND_bytes((uchar *)((long)&gtest_ar__3.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                + 4),4);
            RAND_bytes((uchar *)((long)&gtest_ar__3.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                + 3),1);
            shared_key
            [(ulong)gtest_ar__3.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_4_ % 0x472 + 0x18] =
                 shared_key
                 [(ulong)gtest_ar__3.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_ % 0x472 + 0x18] ^
                 (byte)(1 << (gtest_ar__3.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._3_1_ & 7));
            local_1e4c = HRSS_decap((uint8_t *)&gtest_ar__2.message_,
                                    (HRSS_private_key *)&gtest_ar_.message_,shared_key + 0x18,0x472)
            ;
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_1e48,&local_1e4c,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e48);
            if (!bVar1) {
              testing::Message::Message(&local_1e58);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar_1.message_,(internal *)local_1e48,
                         (AssertionResult *)
                         "HRSS_decap(shared_key2, &priv, ciphertext, sizeof(ciphertext))","false",
                         "true",in_R9);
              pcVar2 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_1e60,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                         ,0xc6,pcVar2);
              testing::internal::AssertHelper::operator=(&local_1e60,&local_1e58);
              testing::internal::AssertHelper::~AssertHelper(&local_1e60);
              std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
              testing::Message::~Message(&local_1e58);
            }
            bVar1 = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e48);
            if (!bVar1) {
              bssl::Span<unsigned_char_const>::Span<32ul>
                        ((Span<unsigned_char_const> *)&local_1eb0,
                         (uchar (*) [32])&gtest_ar__1.message_);
              Bytes::Bytes(&local_1ea0,local_1eb0);
              bssl::Span<unsigned_char_const>::Span<32ul>
                        ((Span<unsigned_char_const> *)&local_1ed0,
                         (uchar (*) [32])&gtest_ar__2.message_);
              Bytes::Bytes(&local_1ec0,local_1ed0);
              testing::internal::CmpHelperNE<Bytes,Bytes>
                        ((internal *)local_1e90,"Bytes(shared_key)","Bytes(shared_key2)",&local_1ea0
                         ,&local_1ec0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e90)
              ;
              if (!bVar1) {
                testing::Message::Message(&local_1ed8);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1e90);
                testing::internal::AssertHelper::AssertHelper
                          (&local_1ee0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                           ,199,pcVar2);
                testing::internal::AssertHelper::operator=(&local_1ee0,&local_1ed8);
                testing::internal::AssertHelper::~AssertHelper(&local_1ee0);
                testing::Message::~Message(&local_1ed8);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e90);
              bVar1 = false;
            }
          }
        }
        testing::ScopedTrace::~ScopedTrace(&local_1859);
        if (bVar1) goto LAB_0047491f;
      }
      bVar1 = false;
    }
LAB_0047491f:
    testing::ScopedTrace::~ScopedTrace(&local_5b9);
    if (bVar1) {
      return;
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

TEST(HRSS, Random) {
  for (unsigned i = 0; i < 10; i++) {
    uint8_t generate_key_entropy[HRSS_GENERATE_KEY_BYTES];
    RAND_bytes(generate_key_entropy, sizeof(generate_key_entropy));
    SCOPED_TRACE(Bytes(generate_key_entropy));

    HRSS_public_key pub;
    HRSS_private_key priv;
    ASSERT_TRUE(HRSS_generate_key(&pub, &priv, generate_key_entropy));

    for (unsigned j = 0; j < 10; j++) {
      uint8_t encap_entropy[HRSS_ENCAP_BYTES];
      RAND_bytes(encap_entropy, sizeof(encap_entropy));
      SCOPED_TRACE(Bytes(encap_entropy));

      uint8_t ciphertext[HRSS_CIPHERTEXT_BYTES];
      uint8_t shared_key[HRSS_KEY_BYTES];
      ASSERT_TRUE(HRSS_encap(ciphertext, shared_key, &pub, encap_entropy));

      uint8_t shared_key2[HRSS_KEY_BYTES];
      ASSERT_TRUE(
          HRSS_decap(shared_key2, &priv, ciphertext, sizeof(ciphertext)));
      EXPECT_EQ(Bytes(shared_key), Bytes(shared_key2));

      uint32_t offset;
      RAND_bytes((uint8_t*) &offset, sizeof(offset));
      uint8_t bit;
      RAND_bytes(&bit, sizeof(bit));
      ciphertext[offset % sizeof(ciphertext)] ^= (1 << (bit & 7));
      ASSERT_TRUE(
          HRSS_decap(shared_key2, &priv, ciphertext, sizeof(ciphertext)));
      EXPECT_NE(Bytes(shared_key), Bytes(shared_key2));
    }
  }
}